

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O2

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,PowConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
          *prepro)

{
  double dVar1;
  double __y;
  double __y_00;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  array<double,_4UL> rb;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  lVar2 = (long)(c->
                super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
                args_._M_elems[0];
  dVar7 = *(double *)(*(long *)(this + 0x40) + lVar2 * 8);
  if (0.0 <= dVar7) {
    lVar4 = (long)(c->
                  super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>)
                  .args_._M_elems[1];
    dVar1 = *(double *)(*(long *)(this + 0x58) + lVar2 * 8);
    __y = *(double *)(*(long *)(this + 0x40) + lVar4 * 8);
    __y_00 = *(double *)(*(long *)(this + 0x58) + lVar4 * 8);
    if ((1e-10 <= dVar7) || (1e-10 <= __y)) {
      local_38 = pow(dVar7,__y);
    }
    else {
      local_38 = pow(1e-10,__y);
      dVar7 = 1e-10;
    }
    local_30 = pow(dVar7,__y_00);
    local_28 = pow(dVar1,__y);
    local_20 = pow(dVar1,__y_00);
    pdVar3 = std::__min_element<double*,__gnu_cxx::__ops::_Iter_less_iter>
                       (&local_38,&stack0xffffffffffffffe8);
    dVar7 = *pdVar3;
    pdVar3 = std::__max_element<double*,__gnu_cxx::__ops::_Iter_less_iter>
                       (&local_38,&stack0xffffffffffffffe8);
    dVar1 = *pdVar3;
    uVar5 = -(ulong)(prepro->lb_ < dVar7);
    uVar6 = -(ulong)(dVar1 < prepro->ub_);
    prepro->lb_ = (double)(~uVar5 & (ulong)prepro->lb_ | (ulong)dVar7 & uVar5);
    prepro->ub_ = (double)(~uVar6 & (ulong)prepro->ub_ | (ulong)dVar1 & uVar6);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      PowConstraint& c, PreprocessInfo& prepro) {
    auto x = c.GetArguments()[0];
    auto lbx = MPCD( lb(x) );
    if (lbx >= 0.0) {
      auto y = c.GetArguments()[1];
      auto ubx = MPCD( ub(x) );
      auto lby = MPCD( lb(y) );
      auto uby = MPCD( ub(y) );
      if (lbx >= 1e-10 || lby >= 1e-10) {
        std::array<double, 4> rb
            {std::pow(lbx, lby), std::pow(lbx, uby),
                                 std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      } else {
        std::array<double, 4> rb
            {std::pow(1e-10, lby), std::pow(1e-10, uby),
             std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      }
    }
  }